

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_TreeEnsemble_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/TreeEnsemble.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  TreeEnsembleParameters_TreeNode_EvaluationInfo::TreeEnsembleParameters_TreeNode_EvaluationInfo
            ((TreeEnsembleParameters_TreeNode_EvaluationInfo *)
             &_TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_);
  DAT_003e35d8 = 1;
  TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode
            ((TreeEnsembleParameters_TreeNode *)&_TreeEnsembleParameters_TreeNode_default_instance_)
  ;
  DAT_003e3650 = 1;
  TreeEnsembleParameters::TreeEnsembleParameters
            ((TreeEnsembleParameters *)&_TreeEnsembleParameters_default_instance_);
  DAT_003e36a8 = 1;
  TreeEnsembleClassifier::TreeEnsembleClassifier
            ((TreeEnsembleClassifier *)&_TreeEnsembleClassifier_default_instance_);
  DAT_003e36e0 = 1;
  TreeEnsembleRegressor::TreeEnsembleRegressor
            ((TreeEnsembleRegressor *)&_TreeEnsembleRegressor_default_instance_);
  DAT_003e3718 = 1;
  DAT_003e36c0 = &_TreeEnsembleParameters_default_instance_;
  DAT_003e3708 = &_TreeEnsembleParameters_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  _TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_.DefaultConstruct();
  _TreeEnsembleParameters_TreeNode_default_instance_.DefaultConstruct();
  _TreeEnsembleParameters_default_instance_.DefaultConstruct();
  _TreeEnsembleClassifier_default_instance_.DefaultConstruct();
  _TreeEnsembleRegressor_default_instance_.DefaultConstruct();
  _TreeEnsembleClassifier_default_instance_.get_mutable()->treeensemble_ = const_cast< ::CoreML::Specification::TreeEnsembleParameters*>(
      ::CoreML::Specification::TreeEnsembleParameters::internal_default_instance());
  _TreeEnsembleRegressor_default_instance_.get_mutable()->treeensemble_ = const_cast< ::CoreML::Specification::TreeEnsembleParameters*>(
      ::CoreML::Specification::TreeEnsembleParameters::internal_default_instance());
}